

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::_evaluateResult<double>
          (SoPlexBase<double> *this,SPxSolverBase<double> *solver,Status result,bool usingRefinedLP,
          SolRational *sol,VectorBase<double> *dualReal,bool *infeasible,bool *unbounded,
          bool *stoppedTime,bool *stoppedIter,bool *error)

{
  double dVar1;
  Verbosity VVar2;
  byte in_CL;
  char *t;
  int in_EDX;
  long *in_RSI;
  SPxOut *in_RDI;
  long in_R8;
  undefined8 uVar3;
  undefined1 *in_stack_00000008;
  undefined1 *in_stack_00000010;
  Verbosity old_verbosity_2;
  undefined1 *in_stack_00000018;
  Verbosity old_verbosity_1;
  undefined1 *in_stack_00000020;
  Verbosity old_verbosity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00000050;
  Verbosity local_48;
  Verbosity local_44 [3];
  Verbosity local_38;
  Verbosity local_34 [3];
  long local_28;
  byte local_1d;
  int local_1c;
  long *local_18;
  bool local_1;
  
  local_1d = in_CL & 1;
  dVar1 = *(double *)(*(long *)&in_RDI[1].m_verbosity + 0xb0);
  local_28 = in_R8;
  local_1c = in_EDX;
  local_18 = in_RSI;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    uVar3 = (**(code **)(**(long **)(*(long *)&in_RDI[1].m_verbosity + 8) + 0x30))();
    *(undefined8 *)(*(long *)&in_RDI[1].m_verbosity + 0xb0) = uVar3;
  }
  if (*(int *)(*(long *)&in_RDI[1].m_verbosity + 200) == 0) {
    *(undefined4 *)(*(long *)&in_RDI[1].m_verbosity + 200) =
         *(undefined4 *)(*(long *)&in_RDI[1].m_verbosity + 0xb8);
  }
  t = (char *)(ulong)(local_1c + 7);
  switch(t) {
  case (char *)0x0:
    *in_stack_00000018 = 1;
    local_1 = true;
    break;
  case (char *)0x1:
    if ((local_1d & 1) != 0) {
      (**(code **)(*local_18 + 0x1f0))();
    }
    *in_stack_00000020 = 1;
    local_1 = true;
    break;
  default:
    if ((local_1d & 1) != 0) {
      (**(code **)(*local_18 + 0x1f0))();
    }
    *(undefined1 *)
     &(dualReal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = 1;
    local_1 = true;
    break;
  case (char *)0x8:
    if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
       (VVar2 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar2)) {
      local_34[0] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
      local_38 = INFO1;
      SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,&local_38);
      soplex::operator<<(in_RDI,t);
      SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_34);
    }
    local_1 = false;
    break;
  case (char *)0x9:
    if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
       (VVar2 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar2)) {
      local_44[0] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
      local_48 = INFO1;
      SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,&local_48);
      soplex::operator<<(in_RDI,t);
      SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_44);
    }
    if ((local_1d & 1) != 0) {
      (**(code **)(*local_18 + 0x1f0))();
    }
    *in_stack_00000010 = 1;
    local_1 = true;
    break;
  case (char *)0xa:
    if ((in_RDI != (SPxOut *)0xfffffffffffffff8) &&
       (VVar2 = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity), 2 < (int)VVar2)) {
      local_44[2] = SPxOut::getVerbosity((SPxOut *)&in_RDI->m_verbosity);
      local_44[1] = 3;
      SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_44 + 1);
      soplex::operator<<(in_RDI,t);
      SPxOut::setVerbosity((SPxOut *)&in_RDI->m_verbosity,local_44 + 2);
    }
    if (((local_1d & 1) == 0) && (((ulong)in_RDI[0x35e]._vptr_SPxOut & 1) == 0)) {
      *(byte *)(local_28 + 0xd0) = *(byte *)(local_28 + 0xd0) & 0xf7;
    }
    else {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=(in_stack_00000050,(VectorBase<double> *)this);
      *(byte *)(local_28 + 0xd0) = *(byte *)(local_28 + 0xd0) & 0xf7 | 8;
    }
    if ((local_1d & 1) != 0) {
      (**(code **)(*local_18 + 0x1f0))();
    }
    *in_stack_00000008 = 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::_evaluateResult(
   SPxSolverBase<T>& solver,
   typename SPxSolverBase<T>::Status result,
   bool usingRefinedLP,
   SolRational& sol,
   VectorBase<T>& dualReal,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error)
{
   // we always evaluate the result after a solve so the first time is a good place to
   // set the fp Time
   if(_statistics->fpTime == 0)
      _statistics->fpTime = _statistics->solvingTime->time();

   if(_statistics->iterationsFP == 0)
      _statistics->iterationsFP = _statistics->iterations;

   switch(result)
   {
   case SPxSolverBase<T>::OPTIMAL:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point optimal.\n");
      return false;

   case SPxSolverBase<T>::INFEASIBLE:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point infeasible.\n");

      // when not using refined LP
      // the floating-point solve returns a Farkas ray if and only if the simplifier was not used, which is exactly
      // the case when a basis could be returned
      if(usingRefinedLP || _hasBasis)
      {
         sol._dualFarkas = dualReal;
         sol._hasDualFarkas = true;
      }
      else
         sol._hasDualFarkas = false;

      if(usingRefinedLP)
         solver.clearRowObjs();

      infeasible = true;
      return true;

   case SPxSolverBase<T>::UNBOUNDED:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point unbounded.\n");

      if(usingRefinedLP)
         solver.clearRowObjs();

      unbounded = true;
      return true;

   case SPxSolverBase<T>::ABORT_TIME:
      stoppedTime = true;
      return true;

   case SPxSolverBase<T>::ABORT_ITER:
      if(usingRefinedLP)
         solver.clearRowObjs();

      stoppedIter = true;
      return true;

   default:
      if(usingRefinedLP)
         solver.clearRowObjs();

      error = true;
      return true;
   }
}